

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

Proto * luaF_newproto(lua_State *L)

{
  Proto *pPVar1;
  
  pPVar1 = (Proto *)luaC_newobj(L,10,0x80);
  pPVar1->numparams = '\0';
  pPVar1->is_vararg = '\0';
  pPVar1->maxstacksize = '\0';
  pPVar1->sizeupvalues = 0;
  pPVar1->sizek = 0;
  pPVar1->sizecode = 0;
  pPVar1->sizelineinfo = 0;
  pPVar1->sizep = 0;
  pPVar1->sizelocvars = 0;
  pPVar1->sizeabslineinfo = 0;
  pPVar1->linedefined = 0;
  pPVar1->lastlinedefined = 0;
  pPVar1->k = (TValue *)0x0;
  pPVar1->code = (Instruction *)0x0;
  pPVar1->p = (Proto **)0x0;
  pPVar1->upvalues = (Upvaldesc *)0x0;
  pPVar1->lineinfo = (ls_byte *)0x0;
  pPVar1->abslineinfo = (AbsLineInfo *)0x0;
  pPVar1->locvars = (LocVar *)0x0;
  pPVar1->source = (TString *)0x0;
  return pPVar1;
}

Assistant:

Proto *luaF_newproto (lua_State *L) {
  GCObject *o = luaC_newobj(L, LUA_VPROTO, sizeof(Proto));
  Proto *f = gco2p(o);
  f->k = NULL;
  f->sizek = 0;
  f->p = NULL;
  f->sizep = 0;
  f->code = NULL;
  f->sizecode = 0;
  f->lineinfo = NULL;
  f->sizelineinfo = 0;
  f->abslineinfo = NULL;
  f->sizeabslineinfo = 0;
  f->upvalues = NULL;
  f->sizeupvalues = 0;
  f->numparams = 0;
  f->is_vararg = 0;
  f->maxstacksize = 0;
  f->locvars = NULL;
  f->sizelocvars = 0;
  f->linedefined = 0;
  f->lastlinedefined = 0;
  f->source = NULL;
  return f;
}